

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O2

int phits_tryload_reclen(phits_fileinternal_t *f,int reclen)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar2 = phits_ensure_load(f,reclen);
  iVar3 = 0;
  if (iVar2 != 0) {
    pcVar1 = f->buf;
    if (reclen == 4) {
      uVar5 = (ulong)*(uint *)pcVar1;
    }
    else {
      uVar5 = *(ulong *)pcVar1;
    }
    uVar4 = (long)(reclen * 2) + uVar5;
    if ((uVar4 & 0xffffffff80000000) != 0) {
      phits_error("Unexpectedly large record encountered");
    }
    iVar2 = phits_ensure_load(f,(int)uVar4);
    if (iVar2 != 0) {
      if (reclen == 4) {
        uVar4 = (ulong)*(uint *)(pcVar1 + (long)reclen + uVar5);
      }
      else {
        uVar4 = *(ulong *)(pcVar1 + (long)reclen + uVar5);
      }
      iVar3 = 0;
      if (uVar5 == uVar4) {
        f->reclen = reclen;
        if ((uVar5 != 0x50) && (uVar5 != 0x68)) {
          phits_error("Unexpected particle size!");
        }
        f->particlesize = (uint)uVar5;
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int phits_tryload_reclen(phits_fileinternal_t* f, int reclen ) {
  assert(reclen==4||reclen==8);
  if ( ! phits_ensure_load( f, reclen ) )
    return 0;
  char * buf = & ( f->buf[0] );
  uint64_t l1 = ( reclen == 4 ? (uint64_t)(*((uint32_t*)buf)) : (uint64_t)(*((uint64_t*)buf)) );
  uint64_t tmp = l1 + 2*reclen;
  if ( tmp > INT_MAX )
    phits_error("Unexpectedly large record encountered");
  if ( ! phits_ensure_load( f, (int)tmp ) )
    return 0;
  buf += (reclen + l1);
  uint64_t l2 = ( reclen == 4 ? (uint64_t)(*((uint32_t*)buf)) : (uint64_t)(*((uint64_t*)buf)) );
  if (l1!=l2)
    return 0;
  //All ok!
  f->reclen = reclen;
  if ( l1 != 10*8 && l1 != 13*8 )
    phits_error("Unexpected particle size!");
  f->particlesize = (unsigned)l1;
  return 1;
}